

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_aug.c
# Opt level: O2

stbi_uc * bmp_load(stbi *s,int *x,int *y,int *comp,int req_comp)

{
  uint uVar1;
  bool bVar2;
  uchar uVar3;
  int iVar4;
  uint32 uVar5;
  uint32 uVar6;
  uint32 uVar7;
  uint32 uVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  uchar *data;
  uint x_00;
  long lVar13;
  int iVar14;
  int iVar15;
  ulong uVar16;
  uint32 z;
  int iVar17;
  uint32 uVar18;
  uint uVar19;
  int iVar20;
  int iVar21;
  ulong uVar22;
  bool bVar23;
  uint local_494;
  uint local_490;
  uint local_474;
  int local_46c;
  int local_468;
  int local_460;
  stbi_uc pal [256] [4];
  
  iVar4 = get8(s);
  if ((iVar4 != 0x42) || (iVar4 = get8(s), iVar4 != 0x4d)) goto LAB_0014c595;
  get32le(s);
  get16le(s);
  get16le(s);
  uVar5 = get32le(s);
  uVar6 = get32le(s);
  if (((0x38 < uVar6) || ((0x100010000001000U >> ((ulong)uVar6 & 0x3f) & 1) == 0)) &&
     (uVar6 != 0x6c)) {
    failure_reason = "BMP type not supported: unknown";
    return (stbi_uc *)0x0;
  }
  failure_reason = "bad BMP";
  if (uVar6 == 0xc) {
    uVar7 = get16le(s);
    s->img_x = uVar7;
    uVar7 = get16le(s);
  }
  else {
    uVar7 = get32le(s);
    s->img_x = uVar7;
    uVar7 = get32le(s);
  }
  s->img_y = uVar7;
  iVar4 = get16le(s);
  if (iVar4 != 1) {
    return (stbi_uc *)0x0;
  }
  iVar4 = get16le(s);
  if (iVar4 == 1) {
    failure_reason = "BMP type not supported: 1-bit";
    return (stbi_uc *)0x0;
  }
  uVar7 = s->img_y;
  uVar18 = -uVar7;
  if (0 < (int)uVar7) {
    uVar18 = uVar7;
  }
  s->img_y = uVar18;
  if (uVar6 == 0xc) {
    uVar18 = 0;
    if (0x17 < iVar4) {
      local_494 = 0;
      local_490 = 0;
      z = 0;
      goto LAB_0014c180;
    }
    uVar19 = (int)(uVar5 - 0x26) / 3;
    local_494 = 0;
    local_490 = 0;
    z = 0;
  }
  else {
    uVar8 = get32le(s);
    if (uVar8 - 1 < 2) {
      failure_reason = "BMP type not supported: RLE";
      return (stbi_uc *)0x0;
    }
    get32le(s);
    get32le(s);
    get32le(s);
    get32le(s);
    get32le(s);
    if (uVar6 == 0x28) {
LAB_0014c02f:
      if (iVar4 != 0x20) {
        uVar18 = 0;
        local_494 = 0;
        local_490 = 0;
        z = 0;
        if (iVar4 != 0x10) goto LAB_0014c102;
      }
      if (uVar8 == 3) {
        z = get32le(s);
        local_490 = get32le(s);
        local_494 = get32le(s);
        if (local_490 == local_494 && z == local_490) {
          return (stbi_uc *)0x0;
        }
        uVar18 = 0;
      }
      else {
        if (uVar8 != 0) {
          return (stbi_uc *)0x0;
        }
        bVar23 = iVar4 == 0x20;
        local_494 = 0x1f;
        if (bVar23) {
          local_494 = 0xff;
        }
        local_490 = 0x3e0;
        if (bVar23) {
          local_490 = 0xff00;
        }
        z = 0x7c00;
        if (bVar23) {
          z = 0xff0000;
        }
        uVar18 = 0;
      }
    }
    else {
      if (uVar6 != 0x6c) {
        if (uVar6 != 0x38) {
          __assert_fail("hsz == 108",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sidneydijkstra[P]SDEN/external/soil/src/stb_image_aug.c"
                        ,0xa15,"stbi_uc *bmp_load(stbi *, int *, int *, int *, int)");
        }
        get32le(s);
        get32le(s);
        get32le(s);
        get32le(s);
        goto LAB_0014c02f;
      }
      z = get32le(s);
      local_490 = get32le(s);
      local_494 = get32le(s);
      uVar18 = get32le(s);
      get32le(s);
      iVar14 = 0xc;
      while (bVar23 = iVar14 != 0, iVar14 = iVar14 + -1, bVar23) {
        get32le(s);
      }
LAB_0014c102:
      if (iVar4 < 0x10) {
        uVar19 = (int)((uVar5 - uVar6) + -0xe) >> 2;
        goto LAB_0014c185;
      }
    }
LAB_0014c180:
    uVar19 = 0;
  }
LAB_0014c185:
  iVar14 = 4 - (uint)(uVar18 == 0);
  s->img_n = iVar14;
  if (2 < req_comp) {
    iVar14 = req_comp;
  }
  data = (uchar *)malloc((ulong)(s->img_x * iVar14 * s->img_y));
  if (data == (uchar *)0x0) {
    failure_reason = "Out of memory";
    return (stbi_uc *)0x0;
  }
  if (iVar4 < 0x10) {
    if ((int)uVar19 < 0x101 && uVar19 != 0) {
      uVar16 = 0;
      uVar22 = 0;
      if (0 < (int)uVar19) {
        uVar22 = (ulong)uVar19;
      }
      for (; uVar22 != uVar16; uVar16 = uVar16 + 1) {
        iVar9 = get8(s);
        pal[uVar16][2] = (stbi_uc)iVar9;
        iVar9 = get8(s);
        pal[uVar16][1] = (stbi_uc)iVar9;
        iVar9 = get8(s);
        pal[uVar16][0] = (stbi_uc)iVar9;
        if (uVar6 != 0xc) {
          get8(s);
        }
        pal[uVar16][3] = 0xff;
      }
      skip(s,(uVar5 - uVar6) + uVar19 * (uVar6 == 0xc | 0xfffffffc) + -0xe);
      if (iVar4 == 4) {
        uVar19 = s->img_x + 1 >> 1;
      }
      else {
        if (iVar4 != 8) goto LAB_0014c1d7;
        uVar19 = s->img_x;
      }
      uVar16 = 0;
      for (iVar9 = 0; uVar5 = s->img_y, iVar9 < (int)uVar5; iVar9 = iVar9 + 1) {
        for (iVar17 = 0; iVar17 < (int)s->img_x; iVar17 = iVar17 + 2) {
          uVar11 = get8(s);
          uVar12 = uVar11 & 0xf;
          uVar1 = (int)uVar11 >> 4;
          if (iVar4 != 4) {
            uVar12 = 0;
            uVar1 = uVar11;
          }
          lVar13 = (long)(int)uVar16;
          uVar22 = lVar13 + 3;
          data[lVar13] = pal[(int)uVar1][0];
          data[lVar13 + 1] = pal[(int)uVar1][1];
          data[lVar13 + 2] = pal[(int)uVar1][2];
          if (iVar14 == 4) {
            data[uVar22] = 0xff;
            uVar22 = (ulong)((int)uVar16 + 4);
          }
          if (iVar17 + 1U == s->img_x) {
            uVar16 = uVar22 & 0xffffffff;
            break;
          }
          if (iVar4 == 8) {
            uVar12 = get8(s);
          }
          lVar13 = (long)(int)uVar22;
          uVar16 = lVar13 + 3;
          data[lVar13] = pal[(int)uVar12][0];
          data[lVar13 + 1] = pal[(int)uVar12][1];
          data[lVar13 + 2] = pal[(int)uVar12][2];
          if (iVar14 == 4) {
            data[uVar16] = 0xff;
            uVar16 = (ulong)((int)uVar22 + 4);
          }
        }
        skip(s,-uVar19 & 3);
      }
      goto LAB_0014c6d6;
    }
LAB_0014c1d7:
    free(data);
    goto LAB_0014c595;
  }
  skip(s,(uVar5 - uVar6) + -0xe);
  if (iVar4 == 0x20) {
    local_474 = 0;
    if (uVar18 != 0xff000000 || (z != 0xff000000 || (local_490 != 0xff00 || local_494 != 0xff)))
    goto LAB_0014c3bc;
    bVar2 = true;
    bVar23 = false;
    iVar9 = 0;
    local_460 = 0;
    local_468 = 0;
    local_46c = 0;
    iVar17 = 0;
  }
  else if (iVar4 == 0x18) {
    local_474 = s->img_x & 3;
    bVar2 = false;
    bVar23 = false;
    iVar9 = 0;
    local_460 = 0;
    local_468 = 0;
    local_46c = 0;
    iVar17 = 0;
  }
  else {
    local_474 = 0;
    if (iVar4 == 0x10) {
      local_474 = s->img_x * 2 & 2;
    }
LAB_0014c3bc:
    if ((local_490 == 0 || z == 0) || local_494 == 0) {
LAB_0014c595:
      failure_reason = "Corrupt BMP";
      return (stbi_uc *)0x0;
    }
    iVar9 = high_bit(z);
    iVar9 = iVar9 + -7;
    iVar17 = bitcount(z);
    local_460 = high_bit(local_490);
    local_460 = local_460 + -7;
    local_468 = high_bit(local_494);
    local_468 = local_468 + -7;
    local_46c = high_bit(uVar18);
    local_46c = local_46c + -7;
    bVar23 = true;
    bVar2 = false;
  }
  iVar20 = 0;
  for (iVar21 = 0; uVar5 = s->img_y, iVar21 < (int)uVar5; iVar21 = iVar21 + 1) {
    if (bVar23) {
      for (iVar15 = 0; iVar15 < (int)s->img_x; iVar15 = iVar15 + 1) {
        if (iVar4 == 0x10) {
          uVar19 = get16le(s);
        }
        else {
          uVar19 = get32le(s);
        }
        iVar10 = shiftsigned(uVar19 & z,iVar9,iVar17);
        lVar13 = (long)iVar20;
        data[lVar13] = (uchar)iVar10;
        iVar10 = shiftsigned(uVar19 & local_490,local_460,iVar17);
        data[lVar13 + 1] = (uchar)iVar10;
        iVar10 = shiftsigned(uVar19 & local_494,local_468,iVar17);
        data[lVar13 + 2] = (uchar)iVar10;
        if (uVar18 == 0) {
          uVar3 = 0xff;
        }
        else {
          iVar10 = shiftsigned(uVar19 & uVar18,local_46c,iVar17);
          uVar3 = (uchar)iVar10;
        }
        uVar16 = lVar13 + 3;
        if (iVar14 == 4) {
          data[uVar16] = uVar3;
          uVar16 = (ulong)(iVar20 + 4);
        }
        iVar20 = (int)uVar16;
      }
    }
    else {
      for (iVar15 = 0; iVar15 < (int)s->img_x; iVar15 = iVar15 + 1) {
        iVar10 = get8(s);
        lVar13 = (long)iVar20;
        data[lVar13 + 2] = (uchar)iVar10;
        iVar10 = get8(s);
        data[lVar13 + 1] = (uchar)iVar10;
        iVar10 = get8(s);
        data[lVar13] = (uchar)iVar10;
        uVar3 = 0xff;
        if (bVar2) {
          iVar10 = get8(s);
          uVar3 = (uchar)iVar10;
        }
        uVar16 = lVar13 + 3;
        if (iVar14 == 4) {
          data[uVar16] = uVar3;
          uVar16 = (ulong)(iVar20 + 4);
        }
        iVar20 = (int)uVar16;
      }
    }
    skip(s,local_474);
  }
LAB_0014c6d6:
  if (0 < (int)uVar7) {
    iVar4 = (int)uVar5 >> 1;
    if ((int)uVar5 >> 1 < 1) {
      iVar4 = 0;
    }
    iVar9 = (uVar5 - 1) * iVar14;
    iVar21 = 0;
    for (iVar17 = 0; iVar17 != iVar4; iVar17 = iVar17 + 1) {
      uVar6 = s->img_x;
      uVar16 = (ulong)(uVar6 * iVar14);
      if ((int)(uVar6 * iVar14) < 1) {
        uVar16 = 0;
      }
      for (uVar22 = 0; uVar16 != uVar22; uVar22 = uVar22 + 1) {
        uVar3 = data[uVar22 + uVar6 * iVar21];
        data[uVar22 + uVar6 * iVar21] = data[uVar22 + uVar6 * iVar9];
        data[uVar22 + uVar6 * iVar9] = uVar3;
      }
      iVar9 = iVar9 - iVar14;
      iVar21 = iVar21 + iVar14;
    }
  }
  x_00 = s->img_x;
  if ((req_comp != 0) && (iVar14 != req_comp)) {
    data = convert_format(data,iVar14,req_comp,x_00,uVar5);
    if (data == (uchar *)0x0) {
      return (stbi_uc *)0x0;
    }
    x_00 = s->img_x;
  }
  *x = x_00;
  *y = s->img_y;
  if (comp != (int *)0x0) {
    *comp = iVar14;
    return data;
  }
  return data;
}

Assistant:

static stbi_uc *bmp_load(stbi *s, int *x, int *y, int *comp, int req_comp)
{
   uint8 *out;
   unsigned int mr=0,mg=0,mb=0,ma=0;
   stbi_uc pal[256][4];
   int psize=0,i,j,compress=0,width;
   int bpp, flip_vertically, pad, target, offset, hsz;
   if (get8(s) != 'B' || get8(s) != 'M') return epuc("not BMP", "Corrupt BMP");
   get32le(s); // discard filesize
   get16le(s); // discard reserved
   get16le(s); // discard reserved
   offset = get32le(s);
   hsz = get32le(s);
   if (hsz != 12 && hsz != 40 && hsz != 56 && hsz != 108) return epuc("unknown BMP", "BMP type not supported: unknown");
   failure_reason = "bad BMP";
   if (hsz == 12) {
      s->img_x = get16le(s);
      s->img_y = get16le(s);
   } else {
      s->img_x = get32le(s);
      s->img_y = get32le(s);
   }
   if (get16le(s) != 1) return 0;
   bpp = get16le(s);
   if (bpp == 1) return epuc("monochrome", "BMP type not supported: 1-bit");
   flip_vertically = ((int) s->img_y) > 0;
   s->img_y = abs((int) s->img_y);
   if (hsz == 12) {
      if (bpp < 24)
         psize = (offset - 14 - 24) / 3;
   } else {
      compress = get32le(s);
      if (compress == 1 || compress == 2) return epuc("BMP RLE", "BMP type not supported: RLE");
      get32le(s); // discard sizeof
      get32le(s); // discard hres
      get32le(s); // discard vres
      get32le(s); // discard colorsused
      get32le(s); // discard max important
      if (hsz == 40 || hsz == 56) {
         if (hsz == 56) {
            get32le(s);
            get32le(s);
            get32le(s);
            get32le(s);
         }
         if (bpp == 16 || bpp == 32) {
            mr = mg = mb = 0;
            if (compress == 0) {
               if (bpp == 32) {
                  mr = 0xff << 16;
                  mg = 0xff <<  8;
                  mb = 0xff <<  0;
               } else {
                  mr = 31 << 10;
                  mg = 31 <<  5;
                  mb = 31 <<  0;
               }
            } else if (compress == 3) {
               mr = get32le(s);
               mg = get32le(s);
               mb = get32le(s);
               // not documented, but generated by photoshop and handled by mspaint
               if (mr == mg && mg == mb) {
                  // ?!?!?
                  return NULL;
               }
            } else
               return NULL;
         }
      } else {
         assert(hsz == 108);
         mr = get32le(s);
         mg = get32le(s);
         mb = get32le(s);
         ma = get32le(s);
         get32le(s); // discard color space
         for (i=0; i < 12; ++i)
            get32le(s); // discard color space parameters
      }
      if (bpp < 16)
         psize = (offset - 14 - hsz) >> 2;
   }
   s->img_n = ma ? 4 : 3;
   if (req_comp && req_comp >= 3) // we can directly decode 3 or 4
      target = req_comp;
   else
      target = s->img_n; // if they want monochrome, we'll post-convert
   out = (stbi_uc *) malloc(target * s->img_x * s->img_y);
   if (!out) return epuc("outofmem", "Out of memory");
   if (bpp < 16) {
      int z=0;
      if (psize == 0 || psize > 256) { free(out); return epuc("invalid", "Corrupt BMP"); }
      for (i=0; i < psize; ++i) {
         pal[i][2] = get8(s);
         pal[i][1] = get8(s);
         pal[i][0] = get8(s);
         if (hsz != 12) get8(s);
         pal[i][3] = 255;
      }
      skip(s, offset - 14 - hsz - psize * (hsz == 12 ? 3 : 4));
      if (bpp == 4) width = (s->img_x + 1) >> 1;
      else if (bpp == 8) width = s->img_x;
      else { free(out); return epuc("bad bpp", "Corrupt BMP"); }
      pad = (-width)&3;
      for (j=0; j < (int) s->img_y; ++j) {
         for (i=0; i < (int) s->img_x; i += 2) {
            int v=get8(s),v2=0;
            if (bpp == 4) {
               v2 = v & 15;
               v >>= 4;
            }
            out[z++] = pal[v][0];
            out[z++] = pal[v][1];
            out[z++] = pal[v][2];
            if (target == 4) out[z++] = 255;
            if (i+1 == (int) s->img_x) break;
            v = (bpp == 8) ? get8(s) : v2;
            out[z++] = pal[v][0];
            out[z++] = pal[v][1];
            out[z++] = pal[v][2];
            if (target == 4) out[z++] = 255;
         }
         skip(s, pad);
      }
   } else {
      int rshift=0,gshift=0,bshift=0,ashift=0,rcount=0,gcount=0,bcount=0,acount=0;
      int z = 0;
      int easy=0;
      skip(s, offset - 14 - hsz);
      if (bpp == 24) width = 3 * s->img_x;
      else if (bpp == 16) width = 2*s->img_x;
      else /* bpp = 32 and pad = 0 */ width=0;
      pad = (-width) & 3;
      if (bpp == 24) {
         easy = 1;
      } else if (bpp == 32) {
         if (mb == 0xff && mg == 0xff00 && mr == 0xff000000 && ma == 0xff000000)
            easy = 2;
      }
      if (!easy) {
         if (!mr || !mg || !mb) return epuc("bad masks", "Corrupt BMP");
         // right shift amt to put high bit in position #7
         rshift = high_bit(mr)-7; rcount = bitcount(mr);
         gshift = high_bit(mg)-7; gcount = bitcount(mr);
         bshift = high_bit(mb)-7; bcount = bitcount(mr);
         ashift = high_bit(ma)-7; acount = bitcount(mr);
      }
      for (j=0; j < (int) s->img_y; ++j) {
         if (easy) {
            for (i=0; i < (int) s->img_x; ++i) {
               int a;
               out[z+2] = get8(s);
               out[z+1] = get8(s);
               out[z+0] = get8(s);
               z += 3;
               a = (easy == 2 ? get8(s) : 255);
               if (target == 4) out[z++] = a;
            }
         } else {
            for (i=0; i < (int) s->img_x; ++i) {
               uint32 v = (bpp == 16 ? get16le(s) : get32le(s));
               int a;
               out[z++] = shiftsigned(v & mr, rshift, rcount);
               out[z++] = shiftsigned(v & mg, gshift, gcount);
               out[z++] = shiftsigned(v & mb, bshift, bcount);
               a = (ma ? shiftsigned(v & ma, ashift, acount) : 255);
               if (target == 4) out[z++] = a;
            }
         }
         skip(s, pad);
      }
   }
   if (flip_vertically) {
      stbi_uc t;
      for (j=0; j < (int) s->img_y>>1; ++j) {
         stbi_uc *p1 = out +      j     *s->img_x*target;
         stbi_uc *p2 = out + (s->img_y-1-j)*s->img_x*target;
         for (i=0; i < (int) s->img_x*target; ++i) {
            t = p1[i], p1[i] = p2[i], p2[i] = t;
         }
      }
   }

   if (req_comp && req_comp != target) {
      out = convert_format(out, target, req_comp, s->img_x, s->img_y);
      if (out == NULL) return out; // convert_format frees input on failure
   }

   *x = s->img_x;
   *y = s->img_y;
   if (comp) *comp = target;
   return out;
}